

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

int dodrink(obj *potion)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  char *drink_choices;
  _func_void *terrain;
  char *potion_descr;
  obj *potion_local;
  
  drink_choices = (char *)0x0;
  if (u.uprops[0x22].intrinsic == 0) {
    if ((((level->locations[u.ux][u.uy].typ == '\x1c') && (u.uprops[0x12].intrinsic == 0)) &&
        (u.uprops[0x12].extrinsic == 0)) && ((youmonst.data)->mlet != '\x05')) {
      drink_choices = (char *)drinkfountain;
    }
    if (level->locations[u.ux][u.uy].typ == '\x1f') {
      drink_choices = (char *)drinksink;
    }
    if ((((byte)u._1052_1_ >> 1 & 1) == 0) ||
       (cVar1 = yn_function("Drink the water around you?","yn",'n'), cVar1 != 'y')) {
      pcVar4 = "\b";
      if (drink_choices != (char *)0x0) {
        pcVar4 = "\x15\x16\b";
      }
      if ((potion == (obj *)0x0) || (bVar2 = validate_object(potion,pcVar4,"drink"), bVar2 != '\0'))
      {
        potion_descr = (char *)potion;
        if (potion == (obj *)0x0) {
          potion_descr = (char *)getobj(pcVar4,"drink",(obj **)0x0);
        }
        if (potion_descr == (char *)0x0) {
          potion_local._4_4_ = 0;
        }
        else if ((obj *)potion_descr == &zeroobj) {
          if (drink_choices == (char *)0x0) {
            warning("dodrink: zeroobj selected without terrain");
            potion_local._4_4_ = 0;
          }
          else {
            (*(code *)drink_choices)();
            potion_local._4_4_ = 1;
          }
        }
        else {
          *(uint *)(potion_descr + 0x4a) = *(uint *)(potion_descr + 0x4a) & 0xff7fffff | 0x800000;
          pcVar4 = obj_descr[objects[*(short *)(potion_descr + 0x2a)].oc_descr_idx].oc_descr;
          if (pcVar4 != (char *)0x0) {
            iVar3 = strcmp(pcVar4,"milky");
            if (((iVar3 == 0) && (flags.ghost_count < 0x78)) &&
               (iVar3 = rn2(flags.ghost_count * 2 + 0xd), iVar3 == 0)) {
              ghost_from_bottle();
              useup((obj *)potion_descr);
              return 1;
            }
            iVar3 = strcmp(pcVar4,"smoky");
            if (((iVar3 == 0) && (flags.djinni_count < 0x78)) &&
               (iVar3 = rn2(flags.djinni_count * 2 + 0xd), iVar3 == 0)) {
              djinni_from_bottle((obj *)potion_descr);
              useup((obj *)potion_descr);
              return 1;
            }
          }
          potion_local._4_4_ = dopotion((obj *)potion_descr);
        }
      }
      else {
        potion_local._4_4_ = 0;
      }
    }
    else {
      if (urole.malenum == 0x159) {
        pline("No thank you, fish make love in it!");
      }
      else {
        pline("Do you know what lives in this water!?");
      }
      potion_local._4_4_ = 1;
    }
  }
  else {
    pline("If you can\'t breathe air, how can you drink liquid?");
    potion_local._4_4_ = 0;
  }
  return potion_local._4_4_;
}

Assistant:

int dodrink(struct obj *potion)
{
	const char *potion_descr;
	void (*terrain)(void) = NULL;
	const char *drink_choices = NULL;

	if (Strangled) {
		pline("If you can't breathe air, how can you drink liquid?");
		return 0;
	}
	/* Is there a fountain to drink from here? */
	if (IS_FOUNTAIN(level->locations[u.ux][u.uy].typ) && !Levitation) {
		terrain = drinkfountain;
	}
	/* Or a kitchen sink? */
	if (IS_SINK(level->locations[u.ux][u.uy].typ)) {
		terrain = drinksink;
	}

	/* Or are you surrounded by water? */
	if (Underwater) {
		if (yn("Drink the water around you?") == 'y') {
			/* Indiana Jones 3 */
			if (Role_if(PM_ARCHEOLOGIST))
			    pline("No thank you, fish make love in it!");
			else
			    pline("Do you know what lives in this water!?");
			return 1;
		}
	}

	drink_choices = terrain ? beverages_and_fountains : beverages;
	if (potion && !validate_object(potion, drink_choices, "drink"))
		return 0;
	else if (!potion)
		potion = getobj(drink_choices, "drink", NULL);
	if (!potion) return 0;

	/* Quaff from fountains and sinks with "q," */
	if (potion == &zeroobj) {
	    if (!terrain) {
		warning("dodrink: zeroobj selected without terrain");
		return 0;
	    }
	    terrain();
	    return 1;
	}

	potion->in_use = TRUE;		/* you've opened the stopper */

#define POTION_OCCUPANT_CHANCE(n) (13 + 2*(n))	/* also in muse.c */

	potion_descr = OBJ_DESCR(objects[potion->otyp]);
	if (potion_descr) {
	    if (!strcmp(potion_descr, "milky") &&
		    flags.ghost_count < MAXMONNO &&
		    !rn2(POTION_OCCUPANT_CHANCE(flags.ghost_count))) {
		ghost_from_bottle();
		useup(potion);
		return 1;
	    } else if (!strcmp(potion_descr, "smoky") &&
		    flags.djinni_count < MAXMONNO &&
		    !rn2(POTION_OCCUPANT_CHANCE(flags.djinni_count))) {
		djinni_from_bottle(potion);
		useup(potion);
		return 1;
	    }
	}
	return dopotion(potion);
}